

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

void __thiscall ON_ShutLiningUserData::SetToDefaults(ON_ShutLiningUserData *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_XMLNode *pOVar2;
  ON_XMLParameters p;
  ON_XMLProperty prop;
  ON_XMLParameters local_180;
  ON_XMLVariant local_170;
  ON_XMLProperty local_78;
  
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty(&local_78);
  iVar1 = (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x1f])
                    (this);
  pOVar2 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar2,L"shut-lining-object-data");
  pOVar2 = (ON_XMLNode *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                     ((long *)CONCAT44(extraout_var,iVar1),pOVar2);
  ON_XMLParameters::ON_XMLParameters(&local_180,pOVar2);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&local_180,L"on",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&local_180,L"faceted",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&local_180,L"auto-update",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ::ON_XMLVariant::ON_XMLVariant(&local_170,false);
  ON_XMLParameters::SetParam(&local_180,L"force-update",&local_170);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  ON_XMLParameters::~ON_XMLParameters(&local_180);
  ON_XMLProperty::~ON_XMLProperty(&local_78);
  return;
}

Assistant:

void ON_ShutLiningUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_ShutLiningUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_SHUTLINING_ROOT));

  ON_XMLParameters p(*root);
  p.SetParam(ON_SHUTLINING_ON, false);
  p.SetParam(ON_SHUTLINING_FACETED, ON_ShutLining::Defaults::Faceted());
  p.SetParam(ON_SHUTLINING_AUTO_UPDATE, ON_ShutLining::Defaults::AutoUpdate());
  p.SetParam(ON_SHUTLINING_FORCE_UPDATE, ON_ShutLining::Defaults::ForceUpdate());
}